

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O0

parameter * __thiscall
clipp::detail::action_provider<clipp::parameter>::set<main::__0,main::__0>
          (action_provider<clipp::parameter> *this,anon_enum_32 *t,anon_enum_32 *v)

{
  parameter *ppVar1;
  assign_value<(unnamed_enum_at__workspace_llm4binary_github_license_all_cmakelists_25_satoshigeyuki[P]Centaurus_src_tool_main_cpp:43:2),_(unnamed_enum_at__workspace_llm4binary_github_license_all_cmakelists_25_satoshigeyuki[P]Centaurus_src_tool_main_cpp:43:2)>
  aVar2;
  assign_value<(unnamed_enum_at__workspace_llm4binary_github_license_all_cmakelists_25_satoshigeyuki[P]Centaurus_src_tool_main_cpp:43:2),_(unnamed_enum_at__workspace_llm4binary_github_license_all_cmakelists_25_satoshigeyuki[P]Centaurus_src_tool_main_cpp:43:2)>
  local_50;
  simple_action local_40;
  anon_enum_32 *local_20;
  anon_enum_32 *v_local;
  anon_enum_32 *t_local;
  action_provider<clipp::parameter> *this_local;
  
  local_20 = v;
  v_local = t;
  t_local = (anon_enum_32 *)this;
  aVar2 = clipp::set<main::__0,main::__0>(t,*v);
  local_50.t_ = aVar2.t_;
  local_50.v_ = aVar2.v_;
  std::function<void()>::function<clipp::detail::assign_value<main::__0,main::__0>,void>
            ((function<void()> *)&local_40,&local_50);
  ppVar1 = call(this,&local_40);
  std::function<void_()>::~function(&local_40);
  return ppVar1;
}

Assistant:

Derived&
    set(Target& t, Value&& v) {
        return call(clipp::set(t, std::forward<Value>(v)));
    }